

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.c
# Opt level: O3

char * TextReplace(char *text,char *replace,char *by)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  char *__dest;
  int iVar8;
  
  if (by == (char *)0x0 || (replace == (char *)0x0 || text == (char *)0x0)) {
    return (char *)0x0;
  }
  if (*replace != '\0') {
    lVar5 = 0;
    do {
      lVar7 = lVar5 + 1;
      lVar5 = lVar5 + 1;
    } while (replace[lVar7] != '\0');
    lVar7 = 0;
    iVar6 = (int)lVar5;
    if (iVar6 != 0) {
      if (*by != '\0') {
        lVar7 = 0;
        do {
          lVar5 = lVar7 + 1;
          lVar7 = lVar7 + 1;
        } while (by[lVar5] != '\0');
      }
      pcVar3 = strstr(text,replace);
      lVar5 = 0;
      iVar8 = 0;
      if (pcVar3 != (char *)0x0) {
        iVar8 = 0;
        do {
          iVar8 = iVar8 + 1;
          pcVar3 = strstr(pcVar3 + iVar6,replace);
        } while (pcVar3 != (char *)0x0);
      }
      if (*text != '\0') {
        lVar5 = 0;
        do {
          lVar1 = lVar5 + 1;
          lVar5 = lVar5 + 1;
        } while (text[lVar1] != '\0');
      }
      pcVar3 = (char *)malloc((ulong)(((int)lVar7 - iVar6) * iVar8 + (int)lVar5 + 1));
      if (pcVar3 != (char *)0x0) {
        __dest = pcVar3;
        if (iVar8 != 0) {
          do {
            pcVar4 = strstr(text,replace);
            iVar2 = (int)pcVar4 - (int)text;
            strncpy(__dest,text,(long)iVar2);
            strcpy(__dest + iVar2,by);
            __dest = __dest + iVar2 + (int)lVar7;
            text = text + (iVar2 + iVar6);
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        strcpy(__dest,text);
        return pcVar3;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char *TextReplace(char *text, const char *replace, const char *by)
{
    // Sanity checks and initialization
    if (!text || !replace || !by) return NULL;

    char *result;

    char *insertPoint;      // Next insert point
    char *temp;             // Temp pointer
    int replaceLen;         // Replace string length of (the string to remove)
    int byLen;              // Replacement length (the string to replace replace by)
    int lastReplacePos;     // Distance between replace and end of last replace
    int count;              // Number of replacements

    replaceLen = TextLength(replace);
    if (replaceLen == 0) return NULL;  // Empty replace causes infinite loop during count

    byLen = TextLength(by);

    // Count the number of replacements needed
    insertPoint = text;
    for (count = 0; (temp = strstr(insertPoint, replace)); count++) insertPoint = temp + replaceLen;

    // Allocate returning string and point temp to it
    temp = result = RL_MALLOC(TextLength(text) + (byLen - replaceLen)*count + 1);

    if (!result) return NULL;   // Memory could not be allocated

    // First time through the loop, all the variable are set correctly from here on,
    //    temp points to the end of the result string
    //    insertPoint points to the next occurrence of replace in text
    //    text points to the remainder of text after "end of replace"
    while (count--)
    {
        insertPoint = strstr(text, replace);
        lastReplacePos = (int)(insertPoint - text);
        temp = strncpy(temp, text, lastReplacePos) + lastReplacePos;
        temp = strcpy(temp, by) + byLen;
        text += lastReplacePos + replaceLen; // Move to next "end of replace"
    }

    // Copy remaind text part after replacement to result (pointed by moving temp)
    strcpy(temp, text);

    return result;
}